

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void wstran_accept_cb(void *arg)

{
  nni_aio *aio;
  nng_err result;
  nng_stream *pnVar1;
  nni_aio *aio_00;
  void *local_48;
  ws_pipe *p;
  nng_stream *local_38;
  
  aio = (nni_aio *)((long)arg + 0x48);
  p = (ws_pipe *)((long)arg + 0x20);
  nni_mtx_lock((nni_mtx *)p);
  pnVar1 = (nng_stream *)nni_aio_get_output(aio,0);
  nni_list_first((nni_list *)((long)arg + 8));
  result = nni_aio_result(aio);
  if (result == NNG_OK) {
    local_38 = pnVar1;
    result = nni_pipe_alloc_listener(&local_48,*(nni_listener **)((long)arg + 0x218));
    if (result != NNG_OK) {
      nng_stream_free(local_38);
      goto LAB_0012e619;
    }
    *(undefined2 *)((long)local_48 + 0x2a) = *arg;
    *(nng_stream **)((long)local_48 + 0x3d0) = local_38;
    nni_list_append((nni_list *)((long)arg + 0x220),local_48);
    wstran_listener_match((ws_listener *)arg);
  }
  else {
LAB_0012e619:
    aio_00 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 8));
    if (aio_00 != (nni_aio *)0x0) {
      nni_aio_list_remove(aio_00);
      nni_aio_finish_error(aio_00,result);
    }
    if (result == NNG_ECLOSED) goto LAB_0012e67e;
  }
  nng_stream_listener_accept(*(nng_stream_listener **)((long)arg + 0x210),aio);
LAB_0012e67e:
  nni_mtx_unlock(&p->mtx);
  return;
}

Assistant:

static void
wstran_accept_cb(void *arg)
{
	ws_listener *l    = arg;
	nni_aio     *aaio = &l->accaio;
	nni_aio     *uaio;
	int          rv;
	ws_pipe     *p;
	nng_stream  *ws;

	nni_mtx_lock(&l->mtx);

	ws   = nni_aio_get_output(aaio, 0);
	uaio = nni_list_first(&l->aios);
	if ((rv = nni_aio_result(aaio)) != 0) {
		goto error;
	}

	rv = nni_pipe_alloc_listener((void **) &p, l->nlistener);
	if (rv != 0) {
		nng_stream_free(ws);
		goto error;
	}
	p->peer = l->peer;
	p->ws   = ws;

	nni_list_append(&l->wait_pipes, p);
	wstran_listener_match(l);
	nng_stream_listener_accept(l->listener, aaio);
	nni_mtx_unlock(&l->mtx);
	return;

error:

	// possibly report this upstream
	if ((uaio = nni_list_first(&l->aios)) != NULL) {
		nni_aio_list_remove(uaio);
		nni_aio_finish_error(uaio, rv);
	}
	if (rv != NNG_ECLOSED) {
		nng_stream_listener_accept(l->listener, aaio);
	}
	nni_mtx_unlock(&l->mtx);
}